

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

MessageLite * google::protobuf::internal::DuplicateIfNonNullInternal(MessageLite *message)

{
  int iVar1;
  undefined4 extraout_var;
  MessageLite *pMVar2;
  
  if (message == (MessageLite *)0x0) {
    pMVar2 = (MessageLite *)0x0;
  }
  else {
    iVar1 = (*message->_vptr_MessageLite[3])();
    pMVar2 = (MessageLite *)CONCAT44(extraout_var,iVar1);
    (*pMVar2->_vptr_MessageLite[10])(pMVar2,message);
  }
  return pMVar2;
}

Assistant:

MessageLite* DuplicateIfNonNullInternal(MessageLite* message) {
  if (message) {
    MessageLite* ret = message->New();
    ret->CheckTypeAndMergeFrom(*message);
    return ret;
  } else {
    return NULL;
  }
}